

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void density::
     heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
     ::cancel_put_impl(ControlBlock *i_control_block)

{
  void *i_dest;
  ulong uVar1;
  uintptr_t uint_pointer;
  
  i_dest = get_element(i_control_block);
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  ::destroy((runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             *)(i_control_block + 1),i_dest);
  uVar1 = i_control_block->m_next;
  if ((uVar1 & 3) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb34);
    uVar1 = i_control_block->m_next;
  }
  i_control_block->m_next = uVar1 + 2;
  return;
}

Assistant:

DENSITY_NO_INLINE static void cancel_put_impl(ControlBlock * i_control_block)
        {
            const auto type_ptr = type_after_control(i_control_block);
            type_ptr->destroy(get_element(i_control_block));

            type_ptr->RUNTIME_TYPE::~RUNTIME_TYPE();

            DENSITY_ASSERT_INTERNAL(
              (i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0);
            i_control_block->m_next += detail::Queue_Dead;
        }